

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastaTest_CompressedParseWholeWithoutTrimming_Test::TestBody
          (BioparserFastaTest_CompressedParseWholeWithoutTrimming_Test *this)

{
  pointer pPVar1;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_60;
  allocator local_31;
  string local_30;
  BioparserFastaTest_CompressedParseWholeWithoutTrimming_Test *local_10;
  BioparserFastaTest_CompressedParseWholeWithoutTrimming_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"sample.fasta.gz",&local_31);
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pPVar1 = std::
           unique_ptr<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ::operator->(&(this->super_BioparserFastaTest).p);
  (*pPVar1->_vptr_Parser[2])(&local_60,pPVar1,0xffffffffffffffff,0);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::operator=(&(this->super_BioparserFastaTest).s,&local_60);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&local_60);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,false);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedParseWholeWithoutTrimming) {
  Setup("sample.fasta.gz");
  s = p->Parse(-1, false);
  Check(false);
}